

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertFromString(DoubleAPFloat *this,StringRef S,roundingMode RM)

{
  opStatus oVar1;
  undefined1 local_80 [32];
  char *local_60;
  size_t local_58;
  opStatus local_4c;
  undefined1 local_48 [4];
  opStatus Ret;
  APFloat Tmp;
  roundingMode RM_local;
  DoubleAPFloat *this_local;
  StringRef S_local;
  
  Tmp.U._20_4_ = RM;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x10bc,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::convertFromString(StringRef, roundingMode)"
                 );
  }
  APFloat::APFloat((APFloat *)local_48,(fltSemantics *)semPPCDoubleDoubleLegacy);
  local_60 = S.Data;
  local_58 = S.Length;
  local_4c = APFloat::convertFromString((APFloat *)local_48,S,Tmp.U._20_4_);
  APFloat::bitcastToAPInt((APFloat *)local_80);
  DoubleAPFloat((DoubleAPFloat *)(local_80 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_80);
  operator=(this,(DoubleAPFloat *)(local_80 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_80 + 0x10));
  APInt::~APInt((APInt *)local_80);
  oVar1 = local_4c;
  APFloat::~APFloat((APFloat *)local_48);
  return oVar1;
}

Assistant:

APFloat::opStatus DoubleAPFloat::convertFromString(StringRef S,
                                                   roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.convertFromString(S, RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}